

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

void __thiscall PolymerWrapper::PolymerWrapper(PolymerWrapper *this,Ptr *polymer)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Reaction).old_prop_ = 0.0;
  (this->super_Reaction).remove_ = false;
  (this->super_Reaction).tRNA_reaction_ = false;
  (this->super_Reaction)._vptr_Reaction = (_func_int **)&PTR_CalculatePropensity_001a5c48;
  peVar2 = (polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->polymer_).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var1 = (polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->polymer_).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (this->polymer_).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_Reaction).old_prop_ = 0.0;
  (**peVar2->_vptr_Polymer)();
  return;
}

Assistant:

PolymerWrapper::PolymerWrapper(Polymer::Ptr polymer) : polymer_(polymer) {
  old_prop_ = 0;
  polymer_->Initialize();
}